

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall OpenMD::VectorAccumulator::clear(VectorAccumulator *this)

{
  Vector3<double> *in_RDI;
  Vector3<double> *in_stack_ffffffffffffffe8;
  
  (in_RDI->super_Vector<double,_3U>).data_[1] = 0.0;
  Vector3<double>::operator=(in_RDI,in_stack_ffffffffffffffe8);
  Vector3<double>::operator=(in_RDI,in_stack_ffffffffffffffe8);
  Vector3<double>::operator=(in_RDI,in_stack_ffffffffffffffe8);
  Vector3<double>::operator=(in_RDI,in_stack_ffffffffffffffe8);
  in_RDI[4].super_Vector<double,_3U>.data_[2] = 0.0;
  in_RDI[5].super_Vector<double,_3U>.data_[0] = 0.0;
  return;
}

Assistant:

void clear() {
      Count_   = 0;
      Avg_     = V3Zero;
      Avg2_    = V3Zero;
      Total_   = V3Zero;
      Val_     = V3Zero;
      AvgLen_  = 0;
      AvgLen2_ = 0;
    }